

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O2

_Bool monster_attack_monster(monster_conflict *mon,monster_conflict *t_mon)

{
  loc grid;
  monster_blow *pmVar1;
  blow_method *pbVar2;
  blow_effect *effect;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  _Bool _Var7;
  _Bool _Var8;
  int iVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  uint32_t uVar12;
  monster_lore *lore;
  melee_effect_handler_f p_Var13;
  monster *pmVar14;
  wchar_t rlev;
  wchar_t timer;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  random_value v;
  random_value dice;
  source origin;
  source sVar18;
  melee_effect_handler_context_t context;
  char m_name [80];
  char t_name [80];
  
  lore = get_lore(mon->race);
  wVar10 = mon->race->level;
  rlev = L'\x01';
  if (L'\x01' < wVar10) {
    rlev = wVar10;
  }
  _Var7 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
  if (!_Var7) {
    monster_desc(m_name,0x50,(monster *)mon,L'̔');
    monster_desc(t_name,0x50,(monster *)t_mon,L'\x15');
    uVar16 = 0xffffffffffffffff;
    bVar6 = 0;
    lVar15 = 0;
    do {
      uVar16 = uVar16 + 1;
      if (z_info->mon_blows_max <= uVar16) break;
      grid = t_mon->grid;
      _Var8 = monster_is_visible((monster *)mon);
      bVar5 = true;
      if (!_Var8) {
        bVar5 = L'\0' < mon->race->light;
      }
      pmVar1 = mon->race->blow;
      pbVar2 = *(blow_method **)((long)&pmVar1->method + lVar15);
      if (pbVar2 == (blow_method *)0x0) break;
      effect = *(blow_effect **)((long)&pmVar1->effect + lVar15);
      if (effect == (blow_effect *)0x0) {
        __assert_fail("effect",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-attack.c"
                      ,0x362,"_Bool monster_attack_monster(struct monster *, struct monster *)");
      }
      uVar3 = *(undefined8 *)((long)&(pmVar1->dice).base + lVar15);
      uVar4 = *(undefined8 *)((long)&(pmVar1->dice).sides + lVar15);
      iVar9 = strcmp(effect->name,"NONE");
      if (iVar9 != 0) {
        wVar10 = chance_of_monster_hit(mon,effect);
        _Var8 = test_hit(wVar10,t_mon->race->ac);
        if (_Var8) goto LAB_001698b2;
        _Var8 = monster_is_visible((monster *)mon);
        if ((_Var8) && (pbVar2->miss == true)) {
          msg("%s misses %s.",m_name,t_name);
        }
        bVar17 = 0;
        goto LAB_00169a8e;
      }
LAB_001698b2:
      _Var8 = pbVar2->stun;
      v.sides = (int)uVar4;
      v.m_bonus = (int)((ulong)uVar4 >> 0x20);
      v.base = (int)uVar3;
      v.dice = (int)((ulong)uVar3 >> 0x20);
      wVar10 = randcalc(v,rlev,RANDOMISE);
      if (mon->m_timed[1] != 0) {
        wVar10 = (wVar10 * 0x4b) / 100;
      }
      p_Var13 = melee_handler_for_blow_effect(effect->name);
      if (p_Var13 == (melee_effect_handler_f)0x0) {
        msg("ERROR: Effect handler not found for %s.",effect->name);
        bVar17 = 1;
      }
      else {
        context.p = (player *)0x0;
        context.ac = t_mon->race->ac;
        context.ddesc = (char *)0x0;
        context.obvious = true;
        context.blinked = (_Bool)(bVar6 & 1);
        context.m_name = m_name;
        context.mon = mon;
        context.t_mon = t_mon;
        context.rlev = rlev;
        context.method = pbVar2;
        context.damage = wVar10;
        (*p_Var13)(&context);
        wVar10 = context.damage;
        bVar17 = context.obvious;
        bVar6 = context.blinked;
      }
      if ((_Var8 == false) || (pmVar14 = square_monster(cave,grid), pmVar14 == (monster *)0x0))
      goto switchD_00169a2e_caseD_0;
      dice.sides = (int)uVar4;
      dice.m_bonus = (int)((ulong)uVar4 >> 0x20);
      dice.base = (int)uVar3;
      dice.dice = (int)((ulong)uVar3 >> 0x20);
      wVar11 = monster_critical(dice,rlev,wVar10);
      timer = L'd';
      switch(wVar11) {
      case L'\0':
        goto switchD_00169a2e_caseD_0;
      case L'\x01':
        uVar12 = 5;
        break;
      case L'\x02':
        uVar12 = 10;
        wVar11 = L'\v';
        break;
      case L'\x03':
        uVar12 = 0x14;
        wVar11 = L'\x15';
        break;
      case L'\x04':
        uVar12 = 0x1e;
        wVar11 = L'\x1f';
        break;
      case L'\x05':
        uVar12 = 0x28;
        wVar11 = L')';
        break;
      case L'\x06':
        goto switchD_00169a2e_caseD_6;
      default:
        timer = L'È';
        goto switchD_00169a2e_caseD_6;
      }
      uVar12 = Rand_div(uVar12);
      timer = uVar12 + wVar11;
      if (timer != L'\0') {
switchD_00169a2e_caseD_6:
        mon_inc_timed((monster *)t_mon,L'\x01',timer,L'\0');
      }
switchD_00169a2e_caseD_0:
      bVar17 = bVar17 | wVar10 != L'\0';
LAB_00169a8e:
      if (bVar5) {
        iVar9 = *(int *)((long)&lore->blows->times_seen + lVar15);
        if (((bVar17 | 10 < iVar9) == 1) && (iVar9 < 0xff)) {
          *(int *)((long)&lore->blows->times_seen + lVar15) = iVar9 + 1;
        }
      }
      lVar15 = lVar15 + 0x30;
      pmVar14 = square_monster(cave,grid);
    } while (pmVar14 != (monster *)0x0);
    if ((bVar6 & 1) != 0) {
      _Var8 = square_isseen(cave,mon->grid);
      if (_Var8) {
        add_monster_message(mon,L'7',true);
      }
      strnfmt((char *)&context,5,"%d",(ulong)((uint)z_info->max_sight * 2 + 5));
      sVar18 = source_monster(mon->midx);
      origin.which = sVar18.which;
      origin._4_4_ = 0;
      origin.what = sVar18.what;
      effect_simple(L';',origin,(char *)&context,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    }
    lore_update(mon->race,lore);
  }
  return !_Var7;
}

Assistant:

bool monster_attack_monster(struct monster *mon, struct monster *t_mon)
{
	struct monster_lore *lore = get_lore(mon->race);
	int rlev = ((mon->race->level >= 1) ? mon->race->level : 1);
	int ap_cnt;
	char m_name[80];
	char t_name[80];
	bool blinked = false;

	/* Not allowed to attack */
	if (rf_has(mon->race->flags, RF_NEVER_BLOW)) return (false);

	/* Get the monster names (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
	monster_desc(t_name, sizeof(t_name), t_mon, MDESC_TARG);

	/* Scan through all blows */
	for (ap_cnt = 0; ap_cnt < z_info->mon_blows_max; ap_cnt++) {
		struct loc grid = t_mon->grid;
		bool visible = monster_is_visible(mon) || (mon->race->light > 0);
		bool obvious = false;

		int damage = 0;
		bool do_stun = false;

		/* Extract the attack infomation */
		struct blow_effect *effect = mon->race->blow[ap_cnt].effect;
		struct blow_method *method = mon->race->blow[ap_cnt].method;
		random_value dice = mon->race->blow[ap_cnt].dice;

		/* No more attacks */
		if (!method) break;

		/* Monster hits monster */
		assert(effect);
		if (streq(effect->name, "NONE") ||
			test_hit(chance_of_monster_hit(mon, effect), t_mon->race->ac)) {
			melee_effect_handler_f effect_handler;

			do_stun = method->stun;

			/* Hack -- assume all attacks are obvious */
			obvious = true;

			/* Roll dice */
			damage = randcalc(dice, rlev, RANDOMISE);

			/* Reduce damage when stunned */
			if (mon->m_timed[MON_TMD_STUN]) {
				damage = (damage * (100 - STUN_DAM_REDUCTION)) / 100;
			}

			/* Perform the actual effect. */
			effect_handler = melee_handler_for_blow_effect(effect->name);
			if (effect_handler != NULL) {
				melee_effect_handler_context_t context = {
					NULL,
					mon,
					t_mon,
					rlev,
					method,
					t_mon->race->ac,
					NULL,
					obvious,
					blinked,
					damage,
					m_name
				};

				effect_handler(&context);

				/* Save any changes made in the handler for later use. */
				obvious = context.obvious;
				blinked = context.blinked;
				damage = context.damage;
			} else {
				msg("ERROR: Effect handler not found for %s.", effect->name);
			}

			/* Handle stun */
			if (do_stun && square_monster(cave, grid)) {
				/* Critical hit (zero if non-critical) */
				int amt, tmp = monster_critical(dice, rlev, damage);

				/* Roll for damage */
				switch (tmp) {
					case 0: amt = 0; break;
					case 1: amt = randint1(5); break;
					case 2: amt = randint1(10) + 10; break;
					case 3: amt = randint1(20) + 20; break;
					case 4: amt = randint1(30) + 30; break;
					case 5: amt = randint1(40) + 40; break;
					case 6: amt = 100; break;
					default: amt = 200; break;
				}

				/* Apply the stun */
				if (amt)
					(void)mon_inc_timed(t_mon, MON_TMD_STUN, amt, 0);
			}
		} else {
			/* Visible monster missed monster, so notify if appropriate. */
			if (monster_is_visible(mon) && method->miss) {
				msg("%s misses %s.", m_name, t_name);
			}
		}

		/* Analyze "visible" monsters only */
		if (visible) {
			/* Count "obvious" attacks (and ones that cause damage) */
			if (obvious || damage || (lore->blows[ap_cnt].times_seen > 10)) {
				/* Count attacks of this type */
				if (lore->blows[ap_cnt].times_seen < UCHAR_MAX)
					lore->blows[ap_cnt].times_seen++;
			}
		}

		/* Skip the other blows if the target has moved or died */
		if (!square_monster(cave, grid)) break;
	}

	/* Blink away */
	if (blinked) {
		char dice[5];

		if (square_isseen(cave, mon->grid)) {
			add_monster_message(mon, MON_MSG_HIT_AND_RUN, true);
		}
		strnfmt(dice, sizeof(dice), "%d", z_info->max_sight * 2 + 5);
		effect_simple(EF_TELEPORT, source_monster(mon->midx), dice, 0, 0, 0, 0, 0, NULL);
	}

	/* Learn lore */
	lore_update(mon->race, lore);

	/* Assume we attacked */
	return (true);
}